

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Siblings *sib,
          __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> first,
          __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last,
          Filtration_value *filt)

{
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last_00;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_bool>
  pVar2;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_false>,_bool>
  pVar3;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_false>,_bool>
  insertion_result;
  undefined1 local_50 [32];
  undefined8 uVar1;
  
  last_00._M_current = last._M_current + 1;
  if ((Filtration_value *)last_00._M_current == filt) {
    pVar3 = insert_node_<true,false,true,Gudhi::Vector_filtration_value_const&>
                      ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>
                        *)local_50,sib,(Vertex_handle)first._M_current,
                       (Vector_filtration_value *)(ulong)(uint)(int)*last._M_current);
    uVar1 = pVar3._8_8_;
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)local_50._0_8_;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_50[8];
  }
  else {
    insert_node_<true,true,false,Gudhi::Vector_filtration_value_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)
               local_50,sib,(Vertex_handle)first._M_current,
               (Vector_filtration_value *)(ulong)(uint)(int)*last._M_current);
    pVar2 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                      (this,sib,(__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>
                                 )*(short **)(local_50._0_8_ + 0x28),last_00,filt);
    uVar1 = pVar2._8_8_;
    if ((this->nodes_label_to_list_)._M_h._M_buckets != (__buckets_ptr)0x0) {
      pVar2 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                        ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>
                          *)(local_50 + 0x10),sib,first,last_00,filt);
      uVar1 = pVar2._8_8_;
    }
  }
  pVar2._8_8_ = uVar1;
  pVar2.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
        *)this;
  return pVar2;
}

Assistant:

std::pair<Simplex_handle, bool> rec_insert_simplex_and_subfaces_sorted(Siblings* sib,
                                                                         ForwardVertexIterator first,
                                                                         ForwardVertexIterator last,
                                                                         const Filtration_value& filt)
  {
    // An alternative strategy would be:
    // - try to find the complete simplex, if found (and low filtration) exit
    // - insert all the vertices at once in sib
    // - loop over those (new or not) simplices, with a recursive call(++first, last)
    Vertex_handle vertex_one = *first;

    if (++first == last) return insert_node_<true, false, true>(sib, vertex_one, filt);

    // TODO: have special code here, we know we are building the whole subtree from scratch.
    auto insertion_result = insert_node_<true, true, false>(sib, vertex_one, filt);

    auto res = rec_insert_simplex_and_subfaces_sorted(insertion_result.first->second.children(), first, last, filt);
    // No need to continue if the full simplex was already there with a low enough filtration value.
    if (res.first != null_simplex()) rec_insert_simplex_and_subfaces_sorted(sib, first, last, filt);
    return res;
  }